

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong_conflict
helper_extr_w_mipsel
          (target_ulong_conflict ac,target_ulong_conflict shift,CPUMIPSState_conflict4 *env)

{
  ulong uVar1;
  byte *pbVar2;
  target_ulong_conflict tVar3;
  long lVar4;
  ulong uVar5;
  
  tVar3 = (env->active_tc).HI[(int)ac];
  lVar4 = CONCAT44(tVar3,(env->active_tc).LO[(int)ac]);
  uVar5 = lVar4 >> ((char)(shift & 0x1f) - 1U & 0x3f);
  if ((shift & 0x1f) == 0) {
    uVar5 = lVar4 * 2;
  }
  if ((((int)tVar3 < 0) || (uVar5 >> 0x20 != 0)) &&
     ((-1 < (int)tVar3 || (uVar5 < 0xffffffff00000000)))) {
    pbVar2 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar2 = *pbVar2 | 0x80;
  }
  uVar1 = uVar5 + 1;
  if (((int)tVar3 >= 0 || uVar1 < 0xffffffff00000000) &&
     (uVar1 >> 0x20 != 0 || (int)tVar3 < 0 == (uVar1 != 0))) {
    pbVar2 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar2 = *pbVar2 | 0x80;
  }
  return (target_ulong_conflict)(uVar5 >> 1);
}

Assistant:

target_ulong helper_extr_w(target_ulong ac, target_ulong shift,
                           CPUMIPSState *env)
{
    int32_t tempI;
    int64_t tempDL[2];

    shift = shift & 0x1F;

    mipsdsp_rndrashift_short_acc(tempDL, ac, shift, env);
    if ((tempDL[1] != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        (tempDL[1] != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    tempI = (tempDL[0] >> 1) & MIPSDSP_LLO;

    tempDL[0] += 1;
    if (tempDL[0] == 0) {
        tempDL[1] += 1;
    }

    if (((tempDL[1] & 0x01) != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        ((tempDL[1] & 0x01) != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)tempI;
}